

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationRuleParser::parseString
          (CollationRuleParser *this,int32_t i,UnicodeString *raw,UErrorCode *errorCode)

{
  ushort uVar1;
  short sVar2;
  UnicodeString *pUVar3;
  UBool UVar4;
  ushort uVar5;
  char16_t cVar6;
  char16_t cVar7;
  int32_t iVar8;
  uint uVar9;
  char *reason;
  int iVar10;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (raw->fUnion).fStackFields.fLengthAndFlags;
    uVar5 = 2;
    if ((uVar1 & 1) == 0) {
      uVar5 = uVar1 & 0x1e;
    }
    (raw->fUnion).fStackFields.fLengthAndFlags = uVar5;
LAB_0023d006:
    pUVar3 = this->rules;
    sVar2 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar8 = (pUVar3->fUnion).fFields.fLength;
    }
    else {
      iVar8 = (int)sVar2 >> 5;
    }
    if (iVar8 <= i) goto LAB_0023d18c;
    iVar10 = i + 1;
    cVar6 = UnicodeString::doCharAt(pUVar3,i);
    uVar9 = (uint)(ushort)cVar6;
    UVar4 = isSyntaxChar(uVar9);
    if (UVar4 == '\0') {
      UVar4 = PatternProps::isWhiteSpace((uint)(ushort)cVar6);
      if (UVar4 != '\0') goto LAB_0023d18c;
      UnicodeString::append(raw,cVar6);
      i = iVar10;
      goto LAB_0023d006;
    }
    if (uVar9 == 0x5c) {
      pUVar3 = this->rules;
      sVar2 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar8 = (pUVar3->fUnion).fFields.fLength;
      }
      else {
        iVar8 = (int)sVar2 >> 5;
      }
      if (iVar10 == iVar8) {
        reason = "backslash escape at the end of the rule string";
        i = iVar10;
        goto LAB_0023d16d;
      }
      uVar9 = UnicodeString::char32At(pUVar3,iVar10);
      UnicodeString::append(raw,uVar9);
      i = (iVar10 - (uint)(uVar9 < 0x10000)) + 2;
      goto LAB_0023d006;
    }
    if (uVar9 == 0x27) {
      pUVar3 = this->rules;
      sVar2 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar8 = (pUVar3->fUnion).fFields.fLength;
      }
      else {
        iVar8 = (int)sVar2 >> 5;
      }
      if ((iVar8 <= iVar10) || (cVar6 = UnicodeString::doCharAt(pUVar3,iVar10), cVar6 != L'\'')) {
        do {
          pUVar3 = this->rules;
          sVar2 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar8 = (pUVar3->fUnion).fFields.fLength;
          }
          else {
            iVar8 = (int)sVar2 >> 5;
          }
          if (iVar10 == iVar8) {
            reason = "quoted literal text missing terminating apostrophe";
            i = iVar10;
            goto LAB_0023d16d;
          }
          i = iVar10 + 1;
          cVar6 = UnicodeString::doCharAt(pUVar3,iVar10);
          if (cVar6 == L'\'') {
            pUVar3 = this->rules;
            sVar2 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
            if (sVar2 < 0) {
              iVar8 = (pUVar3->fUnion).fFields.fLength;
            }
            else {
              iVar8 = (int)sVar2 >> 5;
            }
            if ((iVar8 <= i) || (cVar7 = UnicodeString::doCharAt(pUVar3,i), cVar7 != L'\''))
            goto LAB_0023d006;
            i = iVar10 + 2;
          }
          UnicodeString::append(raw,cVar6);
          iVar10 = i;
        } while( true );
      }
      UnicodeString::append(raw,L'\'');
      i = i + 2;
      goto LAB_0023d006;
    }
LAB_0023d18c:
    iVar8 = 0;
    reason = "string contains U+FFFD, U+FFFE or U+FFFF";
    while( true ) {
      sVar2 = (raw->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar10 = (raw->fUnion).fFields.fLength;
      }
      else {
        iVar10 = (int)sVar2 >> 5;
      }
      if (iVar10 <= iVar8) {
        return i;
      }
      uVar9 = UnicodeString::char32At(raw,iVar8);
      if ((uVar9 & 0xfffff800) == 0xd800) break;
      if (uVar9 - 0xfffd < 3) goto LAB_0023d16d;
      iVar8 = (iVar8 - (uint)(uVar9 < 0x10000)) + 2;
    }
    reason = "string contains an unpaired surrogate";
LAB_0023d16d:
    setParseError(this,reason,errorCode);
  }
  return i;
}

Assistant:

int32_t
CollationRuleParser::parseString(int32_t i, UnicodeString &raw, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return i; }
    raw.remove();
    while(i < rules->length()) {
        UChar32 c = rules->charAt(i++);
        if(isSyntaxChar(c)) {
            if(c == 0x27) {  // apostrophe
                if(i < rules->length() && rules->charAt(i) == 0x27) {
                    // Double apostrophe, encodes a single one.
                    raw.append((UChar)0x27);
                    ++i;
                    continue;
                }
                // Quote literal text until the next single apostrophe.
                for(;;) {
                    if(i == rules->length()) {
                        setParseError("quoted literal text missing terminating apostrophe", errorCode);
                        return i;
                    }
                    c = rules->charAt(i++);
                    if(c == 0x27) {
                        if(i < rules->length() && rules->charAt(i) == 0x27) {
                            // Double apostrophe inside quoted literal text,
                            // still encodes a single apostrophe.
                            ++i;
                        } else {
                            break;
                        }
                    }
                    raw.append((UChar)c);
                }
            } else if(c == 0x5c) {  // backslash
                if(i == rules->length()) {
                    setParseError("backslash escape at the end of the rule string", errorCode);
                    return i;
                }
                c = rules->char32At(i);
                raw.append(c);
                i += U16_LENGTH(c);
            } else {
                // Any other syntax character terminates a string.
                --i;
                break;
            }
        } else if(PatternProps::isWhiteSpace(c)) {
            // Unquoted white space terminates a string.
            --i;
            break;
        } else {
            raw.append((UChar)c);
        }
    }
    for(int32_t j = 0; j < raw.length();) {
        UChar32 c = raw.char32At(j);
        if(U_IS_SURROGATE(c)) {
            setParseError("string contains an unpaired surrogate", errorCode);
            return i;
        }
        if(0xfffd <= c && c <= 0xffff) {
            setParseError("string contains U+FFFD, U+FFFE or U+FFFF", errorCode);
            return i;
        }
        j += U16_LENGTH(c);
    }
    return i;
}